

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.cpp
# Opt level: O1

string * __thiscall
lambda::parse_from(std::istream&)::helper::get_var_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  string_view s;
  Shared_string local_38;
  
  while( true ) {
    parse_from::helper::eat_whitespace((helper *)this);
    iVar2 = std::istream::get();
    if (iVar2 != 0x28) break;
    iVar3 = std::istream::peek();
    if (iVar3 != 0x2a) break;
    std::istream::get();
    parse_from::helper::comment((helper *)this);
  }
  iVar3 = isalpha(iVar2);
  if ((iVar2 != 0x5f) && (iVar3 == 0)) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x20);
    s._M_str = "expected a variable";
    s._M_len = 0x13;
    ublib::Shared_string::Shared_string(&local_38,s);
    _Var1._M_pi = local_38.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    *puVar4 = &PTR__Parse_error_00109b70;
    puVar4[1] = local_38.length_;
    puVar4[2] = local_38.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
    puVar4[3] = 0;
    local_38.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    puVar4[3] = _Var1._M_pi;
    local_38.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    __cxa_throw(puVar4,&Parse_error::typeinfo,Parse_error::~Parse_error);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  while( true ) {
    iVar2 = std::istream::peek();
    iVar3 = isalnum(iVar2);
    if (((iVar3 == 0) && (iVar2 != 0x5f)) && (iVar2 != 0x27)) break;
    std::istream::get();
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_var() {
      eat_whitespace();
      auto ch = inp.get();

      if (ch == '(' and inp.peek() == '*') {
        inp.get();
        comment();
        return get_var();
      }

      if (not(std::isalpha(ch) or ch == '_')) {
        throw Parse_error("expected a variable");
      }

      std::string buffer;
      buffer.push_back(static_cast<char>(ch));
      for (;;) {
        ch = inp.peek();
        if (std::isalnum(ch) or ch == '_' or ch == '\'') {
          inp.get();
          buffer.push_back(static_cast<char>(ch));
        } else {
          break;
        }
      }
      return buffer;
    }